

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

int src_simple(SRC_DATA *src_data,int converter,int channels)

{
  int local_2c;
  SRC_STATE *pSStack_28;
  int error;
  SRC_STATE *src_state;
  int channels_local;
  int converter_local;
  SRC_DATA *src_data_local;
  
  src_state._0_4_ = channels;
  src_state._4_4_ = converter;
  _channels_local = src_data;
  pSStack_28 = src_new(converter,channels,&local_2c);
  if (pSStack_28 == (SRC_STATE *)0x0) {
    src_data_local._4_4_ = local_2c;
  }
  else {
    _channels_local->end_of_input = 1;
    local_2c = src_process(pSStack_28,_channels_local);
    src_delete(pSStack_28);
    src_data_local._4_4_ = local_2c;
  }
  return src_data_local._4_4_;
}

Assistant:

int
src_simple (SRC_DATA *src_data, int converter, int channels)
{	SRC_STATE	*src_state ;
	int 		error ;

	if ((src_state = src_new (converter, channels, &error)) == NULL)
		return error ;

	src_data->end_of_input = 1 ; /* Only one buffer worth of input. */

	error = src_process (src_state, src_data) ;

	src_delete (src_state) ;

	return error ;
}